

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Performance.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int64 iVar1;
  int64 iVar2;
  int iVar3;
  
  iVar3 = 3;
  do {
    Console::printf("testMapStd...  ");
    iVar1 = Time::microTicks();
    testMapStd(1000000);
    iVar2 = Time::microTicks();
    Console::printf("%lld microseconds\n",iVar2 - iVar1);
    Console::printf("testMapNStd... ");
    iVar1 = Time::microTicks();
    testMapNStd(1000000);
    iVar2 = Time::microTicks();
    Console::printf("%lld microseconds\n",iVar2 - iVar1);
    Console::printf("testHashMapStd...  ");
    iVar1 = Time::microTicks();
    testHashMapStd(1000000);
    iVar2 = Time::microTicks();
    Console::printf("%lld microseconds\n",iVar2 - iVar1);
    Console::printf("testHashMapNStd... ");
    iVar1 = Time::microTicks();
    testHashMapNStd(1000000);
    iVar2 = Time::microTicks();
    Console::printf("%lld microseconds\n",iVar2 - iVar1);
    Console::printf("testStringStd...  ");
    iVar1 = Time::microTicks();
    testStringStd(1000000);
    iVar2 = Time::microTicks();
    Console::printf("%lld microseconds\n",iVar2 - iVar1);
    Console::printf("testStringNStd... ");
    iVar1 = Time::microTicks();
    testStringNStd(1000000);
    iVar2 = Time::microTicks();
    Console::printf("%lld microseconds\n",iVar2 - iVar1);
    Console::printf("testFutureStd...  ");
    iVar1 = Time::microTicks();
    testFutureStd(100000);
    iVar2 = Time::microTicks();
    Console::printf("%lld microseconds\n",iVar2 - iVar1);
    Console::printf("testFutureNStd... ");
    iVar1 = Time::microTicks();
    testFutureNStd(100000);
    iVar2 = Time::microTicks();
    Console::printf("%lld microseconds\n",iVar2 - iVar1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  for (int i = 0; i < 3; ++i)
  {
    {
      Console::printf("testMapStd...  ");
      int64 startTime = Time::microTicks();
      testMapStd(mapTestIterations);
      int64 duration = Time::microTicks() - startTime;
      Console::printf("%lld microseconds\n", duration);
    }

    {
      Console::printf("testMapNStd... ");
      int64 startTime = Time::microTicks();
      testMapNStd(mapTestIterations);
      int64 duration = Time::microTicks() - startTime;
      Console::printf("%lld microseconds\n", duration);
    }
    {
      Console::printf("testHashMapStd...  ");
      int64 startTime = Time::microTicks();
      testHashMapStd(mapTestIterations);
      int64 duration = Time::microTicks() - startTime;
      Console::printf("%lld microseconds\n", duration);
    }

    {
      Console::printf("testHashMapNStd... ");
      int64 startTime = Time::microTicks();
      testHashMapNStd(mapTestIterations);
      int64 duration = Time::microTicks() - startTime;
      Console::printf("%lld microseconds\n", duration);
    }
    {
      Console::printf("testStringStd...  ");
      int64 startTime = Time::microTicks();
      testStringStd(mapTestIterations);
      int64 duration = Time::microTicks() - startTime;
      Console::printf("%lld microseconds\n", duration);
    }

    {
      Console::printf("testStringNStd... ");
      int64 startTime = Time::microTicks();
      testStringNStd(mapTestIterations);
      int64 duration = Time::microTicks() - startTime;
      Console::printf("%lld microseconds\n", duration);
    }

    {
      Console::printf("testFutureStd...  ");
      int64 startTime = Time::microTicks();
      testFutureStd(mapTestIterations / 10);
      int64 duration = Time::microTicks() - startTime;
      Console::printf("%lld microseconds\n", duration);
    }

    {
      Console::printf("testFutureNStd... ");
      int64 startTime = Time::microTicks();
      testFutureNStd(mapTestIterations / 10);
      int64 duration = Time::microTicks() - startTime;
      Console::printf("%lld microseconds\n", duration);
    }
  }

  return 0;
}